

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

MemberIterator __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
DoFindMember<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name)

{
  uint16_t uVar1;
  bool bVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs;
  
  if ((name->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x4fa,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberBegin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
        ((ulong)(name->data_).s.str & 0xffffffffffff);
  uVar1 = (name->data_).f.flags;
  while( true ) {
    if (uVar1 != 3) {
      *(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)&this->data_ = rhs;
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x4fd,
                    "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    if ((rhs == (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                ((ulong)(name->data_).s.length * 0x20 +
                ((ulong)(name->data_).s.str & 0xffffffffffff))) ||
       (bVar2 = StringEqual<rapidjson::CrtAllocator>(in_RDX,rhs), bVar2)) break;
    rhs = rhs + 2;
    uVar1 = (name->data_).f.flags;
  }
  *(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)&this->data_ = rhs;
  return (MemberIterator)(Pointer)this;
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }